

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

void Exa_ManPrintSolution(Exa_Man_t *p,int fCompl)

{
  uint i;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  
  printf("Realization of given %d-input function using %d two-input gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  uVar4 = p->nObjs;
  while (p->nVars < (int)uVar4) {
    i = uVar4 - 1;
    iVar9 = i - p->nVars;
    uVar1 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar9 * 3 + 1);
    uVar2 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar9 * 3 + 2);
    uVar3 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar9 * 3 + 3);
    if ((fCompl == 0) || (uVar4 != p->nObjs)) {
      pcVar7 = "%02d = 4\'b%d%d%d0(";
      uVar6 = (ulong)uVar3;
      uVar5 = (ulong)uVar2;
      uVar8 = (ulong)uVar1;
    }
    else {
      uVar6 = (ulong)(uVar3 == 0);
      uVar5 = (ulong)(uVar2 == 0);
      uVar8 = (ulong)(uVar1 == 0);
      pcVar7 = "%02d = 4\'b%d%d%d1(";
    }
    printf(pcVar7,(ulong)i,uVar6,uVar5,uVar8);
    for (iVar9 = 1; -1 < iVar9; iVar9 = iVar9 + -1) {
      uVar4 = Exa_ManFindFanin(p,i,iVar9);
      if (((int)uVar4 < 0) || (p->nVars <= (int)uVar4)) {
        pcVar7 = " %02d";
      }
      else {
        uVar4 = uVar4 + 0x61;
        pcVar7 = " %c";
      }
      printf(pcVar7,(ulong)uVar4);
    }
    puts(" )");
    uVar4 = i;
  }
  return;
}

Assistant:

void Exa_ManPrintSolution( Exa_Man_t * p, int fCompl )
{
    int i, k, iVar;
    printf( "Realization of given %d-input function using %d two-input gates:\n", p->nVars, p->nNodes );
//    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    for ( i = p->nObjs - 1; i >= p->nVars; i-- )
    {
        int iVarStart = 1 + 3*(i - p->nVars);
        int Val1 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart);
        int Val2 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+1);
        int Val3 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+2);
        if ( i == p->nObjs - 1 && fCompl )
            printf( "%02d = 4\'b%d%d%d1(", i, !Val3, !Val2, !Val1 );
        else
            printf( "%02d = 4\'b%d%d%d0(", i, Val3, Val2, Val1 );
        for ( k = 1; k >= 0; k-- )
        {
            iVar = Exa_ManFindFanin( p, i, k );
            if ( iVar >= 0 && iVar < p->nVars )
                printf( " %c", 'a'+iVar );
            else
                printf( " %02d", iVar );
        }
        printf( " )\n" );
    }
}